

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O0

GLuint __thiscall
glcts::anon_unknown_0::ImageSizeMachine::CreateComputeProgram(ImageSizeMachine *this,string *cs)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  char *local_38;
  char *src [2];
  GLuint sh;
  GLuint p;
  string *cs_local;
  ImageSizeMachine *this_local;
  
  src[1]._4_4_ = glu::CallLogWrapper::glCreateProgram(&(this->super_GLWrapper).super_CallLogWrapper)
  ;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    src[1]._0_4_ = glu::CallLogWrapper::glCreateShader
                             (&(this->super_GLWrapper).super_CallLogWrapper,0x91b9);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_GLWrapper).super_CallLogWrapper,src[1]._4_4_,(GLuint)src[1]);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_GLWrapper).super_CallLogWrapper,(GLuint)src[1]);
    local_38 = 
    "#version 310 es\n\nprecision highp float;\nprecision highp int;\nprecision highp image2D;\nprecision highp image3D;\nprecision highp imageCube;\nprecision highp image2DArray;\nprecision highp iimage2D;\nprecision highp iimage3D;\nprecision highp iimageCube;\nprecision highp iimage2DArray;\nprecision highp uimage2D;\nprecision highp uimage3D;\nprecision highp uimageCube;\nprecision highp uimage2DArray;"
    ;
    src[0] = (char *)std::__cxx11::string::c_str();
    glu::CallLogWrapper::glShaderSource
              (&(this->super_GLWrapper).super_CallLogWrapper,(GLuint)src[1],2,&local_38,(GLint *)0x0
              );
    bVar1 = CompileShader(this,(GLuint)src[1]);
    if (!bVar1) {
      anon_unknown_0::Output("%s%s\n",local_38,src[0]);
      return src[1]._4_4_;
    }
  }
  bVar1 = LinkProgram(this,src[1]._4_4_);
  if (bVar1) {
    this_local._4_4_ = src[1]._4_4_;
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      uVar3 = std::__cxx11::string::c_str();
      anon_unknown_0::Output
                ("%s%s\n",
                 "#version 310 es\n\nprecision highp float;\nprecision highp int;\nprecision highp image2D;\nprecision highp image3D;\nprecision highp imageCube;\nprecision highp image2DArray;\nprecision highp iimage2D;\nprecision highp iimage3D;\nprecision highp iimageCube;\nprecision highp iimage2DArray;\nprecision highp uimage2D;\nprecision highp uimage3D;\nprecision highp uimageCube;\nprecision highp uimage2DArray;"
                 ,uVar3);
    }
    this_local._4_4_ = src[1]._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

GLuint CreateComputeProgram(const std::string& cs)
	{
		const GLuint p = glCreateProgram();

		if (!cs.empty())
		{
			const GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, cs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			if (!CompileShader(sh))
			{
				Output("%s%s\n", src[0], src[1]);
				return p;
			}
		}
		if (!LinkProgram(p))
		{
			if (!cs.empty())
				Output("%s%s\n", kGLSLVer, cs.c_str());
			return p;
		}

		return p;
	}